

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void innerLoopLoadRow(Parse *pParse,Select *pSelect,RowLoadInfo *pInfo)

{
  RowLoadInfo *pInfo_local;
  Select *pSelect_local;
  Parse *pParse_local;
  
  sqlite3ExprCodeExprList(pParse,pSelect->pEList,pInfo->regResult,0,pInfo->ecelFlags);
  return;
}

Assistant:

static void innerLoopLoadRow(
  Parse *pParse,             /* Statement under construction */
  Select *pSelect,           /* The query being coded */
  RowLoadInfo *pInfo         /* Info needed to complete the row load */
){
  sqlite3ExprCodeExprList(pParse, pSelect->pEList, pInfo->regResult,
                          0, pInfo->ecelFlags);
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
  if( pInfo->pExtra ){
    sqlite3ExprCodeExprList(pParse, pInfo->pExtra, pInfo->regExtraResult, 0, 0);
    sqlite3ExprListDelete(pParse->db, pInfo->pExtra);
  }
#endif
}